

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

BrotliDecoderErrorCode
DecodeContextMap(uint32_t context_map_size,uint32_t *num_htrees,uint8_t **context_map_arg,
                BrotliDecoderStateInternal *s)

{
  size_t sVar1;
  byte *pbVar2;
  BrotliDecoderErrorCode BVar3;
  int iVar4;
  uint8_t *puVar5;
  HuffmanCode *pHVar6;
  ulong uVar7;
  uint uVar8;
  HuffmanCode *table;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  BrotliRunningContextMapState BVar13;
  bool bVar14;
  uint32_t code;
  BrotliBitReader *local_48;
  uint8_t **local_40;
  HuffmanCode *local_38;
  
  BVar13 = (s->arena).header.substate_context_map;
  if (BROTLI_STATE_CONTEXT_MAP_TRANSFORM < BVar13) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  local_48 = &s->br;
  switch(BVar13) {
  case BROTLI_STATE_CONTEXT_MAP_NONE:
    BVar3 = DecodeVarLenUint8(s,local_48,num_htrees);
    if (BVar3 != BROTLI_DECODER_SUCCESS) {
      return BVar3;
    }
    *num_htrees = *num_htrees + 1;
    (s->arena).header.context_index = 0;
    puVar5 = (uint8_t *)(*s->alloc_func)(s->memory_manager_opaque,(ulong)context_map_size);
    *context_map_arg = puVar5;
    if (puVar5 == (uint8_t *)0x0) {
      return BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP;
    }
    if (*num_htrees < 2) {
      memset(puVar5,0,(ulong)context_map_size);
      return BROTLI_DECODER_SUCCESS;
    }
    (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
  case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX:
    uVar11 = (s->br).bit_pos_;
    while (uVar11 - 0x3c < 5) {
      sVar1 = (s->br).avail_in;
      if (sVar1 == 0) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar7 = (s->br).val_;
      pbVar2 = (s->br).next_in;
      (s->br).val_ = uVar7 >> 8;
      (s->br).val_ = (ulong)*pbVar2 << 0x38 | uVar7 >> 8;
      uVar11 = uVar11 - 8;
      (s->br).bit_pos_ = uVar11;
      (s->br).avail_in = sVar1 - 1;
      (s->br).next_in = pbVar2 + 1;
    }
    uVar8 = (uint)((s->br).val_ >> ((byte)uVar11 & 0x3f));
    uVar10 = uVar8 & 1;
    uVar12 = (uVar8 >> 1 & 0xf) + 1 & -uVar10;
    (s->arena).header.max_run_length_prefix = uVar12;
    (s->br).bit_pos_ = uVar11 + uVar10 * 4 + 1;
    (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
    break;
  case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
    uVar12 = (s->arena).header.max_run_length_prefix;
    break;
  case BROTLI_STATE_CONTEXT_MAP_DECODE:
    uVar10 = (s->arena).header.code;
    goto LAB_00103adf;
  case BROTLI_STATE_CONTEXT_MAP_TRANSFORM:
    goto switchD_001039a2_caseD_4;
  }
  BVar3 = ReadHuffmanCode(uVar12 + *num_htrees,uVar12 + *num_htrees,
                          (s->arena).header.context_map_table,(uint32_t *)0x0,s);
  if (BVar3 == BROTLI_DECODER_SUCCESS) {
    (s->arena).header.code = 0xffff;
    (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
    uVar10 = 0xffff;
LAB_00103adf:
    uVar12 = (s->arena).header.context_index;
    uVar8 = (s->arena).header.max_run_length_prefix;
    puVar5 = *context_map_arg;
    table = (s->arena).header.context_map_table;
    bVar14 = uVar10 != 0xffff;
    code = uVar10;
    local_40 = context_map_arg;
    while (context_map_arg = local_40, uVar12 < context_map_size || bVar14) {
      uVar11 = (s->br).bit_pos_;
      if (bVar14) {
LAB_00103c2c:
        for (iVar4 = -uVar11; uVar11 = uVar11 - 8, iVar4 + 0x40U < uVar10; iVar4 = iVar4 + 8) {
          sVar1 = (s->br).avail_in;
          if (sVar1 == 0) {
LAB_00103d7d:
            (s->arena).header.code = uVar10;
            (s->arena).header.context_index = uVar12;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          uVar7 = (s->br).val_;
          pbVar2 = (s->br).next_in;
          (s->br).val_ = uVar7 >> 8;
          (s->br).val_ = (ulong)*pbVar2 << 0x38 | uVar7 >> 8;
          (s->br).bit_pos_ = uVar11;
          (s->br).avail_in = sVar1 - 1;
          (s->br).next_in = pbVar2 + 1;
        }
        uVar9 = kBitMask[uVar10];
        (s->br).bit_pos_ = uVar10 - iVar4;
        iVar4 = (1 << ((byte)uVar10 & 0x1f)) +
                ((uint)((s->br).val_ >> (-(char)iVar4 & 0x3fU)) & uVar9);
        if (context_map_size < iVar4 + uVar12) {
          return BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT;
        }
        do {
          uVar7 = (ulong)uVar12;
          uVar12 = uVar12 + 1;
          puVar5[uVar7] = '\0';
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      else {
        for (uVar10 = uVar11 - 0x32; uVar10 < 0xf; uVar10 = uVar10 - 8) {
          sVar1 = (s->br).avail_in;
          if (sVar1 == 0) {
            local_38 = table;
            iVar4 = SafeDecodeSymbol(table,local_48,&code);
            table = local_38;
            if (iVar4 != 0) goto LAB_00103c15;
            uVar10 = 0xffff;
            goto LAB_00103d7d;
          }
          uVar7 = (s->br).val_;
          pbVar2 = (s->br).next_in;
          (s->br).val_ = uVar7 >> 8;
          (s->br).val_ = (ulong)*pbVar2 << 0x38 | uVar7 >> 8;
          (s->br).bit_pos_ = uVar10 + 0x2a;
          (s->br).avail_in = sVar1 - 1;
          (s->br).next_in = pbVar2 + 1;
        }
        iVar4 = uVar10 + 0x32;
        uVar7 = local_48->val_ >> ((byte)iVar4 & 0x3f);
        pHVar6 = table + (uVar7 & 0xff);
        uVar9 = (uint)pHVar6->bits;
        if (8 < uVar9) {
          iVar4 = uVar10 + 0x3a;
          pHVar6 = pHVar6 + (((uint)(uVar7 >> 8) & 0xffffff & kBitMask[pHVar6->bits - 8] & 0x7f) +
                            (uint)pHVar6->value);
          uVar9 = (uint)pHVar6->bits;
        }
        (s->br).bit_pos_ = uVar9 + iVar4;
        code = (uint32_t)pHVar6->value;
LAB_00103c15:
        if (code == 0) {
          iVar4 = 0;
          uVar10 = 0;
        }
        else {
          iVar4 = code - uVar8;
          uVar10 = code;
          if (code < uVar8 || iVar4 == 0) {
            uVar11 = (s->br).bit_pos_;
            goto LAB_00103c2c;
          }
        }
        uVar7 = (ulong)uVar12;
        uVar12 = uVar12 + 1;
        puVar5[uVar7] = (uint8_t)iVar4;
      }
      bVar14 = false;
    }
switchD_001039a2_caseD_4:
    BVar3 = BROTLI_DECODER_SUCCESS;
    BVar13 = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
    uVar7 = (ulong)(s->br).bit_pos_;
    while ((int)uVar7 == 0x40) {
      sVar1 = (s->br).avail_in;
      if (sVar1 == 0) {
        BVar3 = BROTLI_DECODER_NEEDS_MORE_INPUT;
        goto LAB_00103d6f;
      }
      uVar7 = (s->br).val_;
      pbVar2 = (s->br).next_in;
      (s->br).val_ = uVar7 >> 8;
      (s->br).val_ = (ulong)*pbVar2 << 0x38 | uVar7 >> 8;
      (s->br).bit_pos_ = 0x38;
      (s->br).avail_in = sVar1 - 1;
      (s->br).next_in = pbVar2 + 1;
      uVar7 = 0x38;
    }
    (s->br).bit_pos_ = (int)uVar7 + 1;
    BVar13 = BROTLI_STATE_CONTEXT_MAP_NONE;
    if (((s->br).val_ >> (uVar7 & 0x3f) & 1) != 0) {
      InverseMoveToFrontTransform(*context_map_arg,context_map_size,s);
    }
LAB_00103d6f:
    (s->arena).header.substate_context_map = BVar13;
  }
  return BVar3;
}

Assistant:

static BrotliDecoderErrorCode DecodeContextMap(uint32_t context_map_size,
                                               uint32_t* num_htrees,
                                               uint8_t** context_map_arg,
                                               BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  BrotliDecoderErrorCode result = BROTLI_DECODER_SUCCESS;
  BrotliMetablockHeaderArena* h = &s->arena.header;

  switch ((int)h->substate_context_map) {
    case BROTLI_STATE_CONTEXT_MAP_NONE:
      result = DecodeVarLenUint8(s, br, num_htrees);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      (*num_htrees)++;
      h->context_index = 0;
      BROTLI_LOG_UINT(context_map_size);
      BROTLI_LOG_UINT(*num_htrees);
      *context_map_arg =
          (uint8_t*)BROTLI_DECODER_ALLOC(s, (size_t)context_map_size);
      if (*context_map_arg == 0) {
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP);
      }
      if (*num_htrees <= 1) {
        memset(*context_map_arg, 0, (size_t)context_map_size);
        return BROTLI_DECODER_SUCCESS;
      }
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX: {
      uint32_t bits;
      /* In next stage ReadHuffmanCode uses at least 4 bits, so it is safe
         to peek 4 bits ahead. */
      if (!BrotliSafeGetBits(br, 5, &bits)) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if ((bits & 1) != 0) { /* Use RLE for zeros. */
        h->max_run_length_prefix = (bits >> 1) + 1;
        BrotliDropBits(br, 5);
      } else {
        h->max_run_length_prefix = 0;
        BrotliDropBits(br, 1);
      }
      BROTLI_LOG_UINT(h->max_run_length_prefix);
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
    }
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_HUFFMAN: {
      uint32_t alphabet_size = *num_htrees + h->max_run_length_prefix;
      result = ReadHuffmanCode(alphabet_size, alphabet_size,
                               h->context_map_table, NULL, s);
      if (result != BROTLI_DECODER_SUCCESS) return result;
      h->code = 0xFFFF;
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
    }
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_DECODE: {
      uint32_t context_index = h->context_index;
      uint32_t max_run_length_prefix = h->max_run_length_prefix;
      uint8_t* context_map = *context_map_arg;
      uint32_t code = h->code;
      BROTLI_BOOL skip_preamble = (code != 0xFFFF);
      while (context_index < context_map_size || skip_preamble) {
        if (!skip_preamble) {
          if (!SafeReadSymbol(h->context_map_table, br, &code)) {
            h->code = 0xFFFF;
            h->context_index = context_index;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          BROTLI_LOG_UINT(code);

          if (code == 0) {
            context_map[context_index++] = 0;
            continue;
          }
          if (code > max_run_length_prefix) {
            context_map[context_index++] =
                (uint8_t)(code - max_run_length_prefix);
            continue;
          }
        } else {
          skip_preamble = BROTLI_FALSE;
        }
        /* RLE sub-stage. */
        {
          uint32_t reps;
          if (!BrotliSafeReadBits(br, code, &reps)) {
            h->code = code;
            h->context_index = context_index;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          reps += 1U << code;
          BROTLI_LOG_UINT(reps);
          if (context_index + reps > context_map_size) {
            return
                BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT);
          }
          do {
            context_map[context_index++] = 0;
          } while (--reps);
        }
      }
    }
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_TRANSFORM: {
      uint32_t bits;
      if (!BrotliSafeReadBits(br, 1, &bits)) {
        h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits != 0) {
        InverseMoveToFrontTransform(*context_map_arg, context_map_size, s);
      }
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_NONE;
      return BROTLI_DECODER_SUCCESS;
    }

    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}